

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O1

Overlay * __thiscall r_exec::AntiPGMOverlay::reduce_view(AntiPGMOverlay *this,View *input)

{
  bool bVar1;
  MatchResult MVar2;
  undefined8 in_RAX;
  PGMOverlay *this_00;
  uint16_t input_index;
  uint16_t local_12;
  
  local_12 = (uint16_t)((ulong)in_RAX >> 0x30);
  MVar2 = PGMOverlay::match(&this->super_PGMOverlay,input,&local_12);
  if (MVar2 != FAILURE) {
    if (MVar2 != SUCCESS) {
      return (Overlay *)0x0;
    }
    if ((this->super_PGMOverlay).input_pattern_indices.used_cell_count != 0) {
      this_00 = (PGMOverlay *)operator_new(0xe8);
      PGMOverlay::PGMOverlay
                (this_00,&this->super_PGMOverlay,local_12,
                 (this->super_PGMOverlay).super_InputLessPGMOverlay.super_Overlay.value_commit_index
                );
      (this_00->super_InputLessPGMOverlay).super_Overlay.super__Object._vptr__Object =
           (_func_int **)&PTR__PGMOverlay_001c1148;
      Overlay::commit((Overlay *)this);
      return (Overlay *)this_00;
    }
    bVar1 = PGMOverlay::check_guards(&this->super_PGMOverlay);
    if (bVar1) {
      AntiPGMController::restart
                ((AntiPGMController *)
                 (this->super_PGMOverlay).super_InputLessPGMOverlay.super_Overlay.controller);
      return (Overlay *)0x0;
    }
  }
  Overlay::rollback((Overlay *)this);
  return (Overlay *)0x0;
}

Assistant:

Overlay *AntiPGMOverlay::reduce_view(r_exec::View *input)
{
    uint16_t input_index;

    switch (match(input, input_index)) {
    case SUCCESS:
        if (input_pattern_indices.size() == 0) { // all patterns matched.
            if (check_guards()) {
                ((AntiPGMController *)controller)->restart();
                return nullptr;
            } else {
                rollback();
                return nullptr;
            }
        } else {
            AntiPGMOverlay *offspring = new AntiPGMOverlay(this, input_index, value_commit_index);
            commit();
            return offspring;
        }

    case FAILURE: // just rollback: let the overlay match other inputs.
        rollback();

    case IMPOSSIBLE:
    default:
        return nullptr;
    }
}